

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::BeamData::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,BeamData *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  BeamData *local_18;
  BeamData *this_local;
  
  local_18 = this;
  this_local = (BeamData *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"BeamData:");
  poVar1 = std::operator<<(poVar1,"\n\tAzimuth Center:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32AziCtr);
  poVar1 = std::operator<<(poVar1,"\n\tAzimuth Sweep:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32AziSwp);
  poVar1 = std::operator<<(poVar1,"\n\tElevation Center:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32EleCtr);
  poVar1 = std::operator<<(poVar1,"\n\tElevation Sweep:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32EleSwp);
  poVar1 = std::operator<<(poVar1,"\n\tBeam Sweep Sync:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32SwpSyn);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString BeamData::GetAsString() const
{
    KStringStream ss;

    ss << "BeamData:"
       << "\n\tAzimuth Center:    " << m_f32AziCtr
       << "\n\tAzimuth Sweep:     " << m_f32AziSwp
       << "\n\tElevation Center:  " << m_f32EleCtr
       << "\n\tElevation Sweep:   " << m_f32EleSwp
       << "\n\tBeam Sweep Sync:   " << m_f32SwpSyn
       << "\n";

    return ss.str();
}